

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

longlong mkvparser::GetUIntLength(IMkvReader *pReader,longlong pos,long *len)

{
  int iVar1;
  longlong lVar2;
  long lVar3;
  uint uVar4;
  uchar b;
  longlong available;
  longlong total;
  byte local_29;
  long local_28;
  long local_20;
  
  lVar2 = -2;
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&local_20,&local_28);
    lVar2 = -2;
    if (((-1 < iVar1) && (local_20 < 0 || local_28 <= local_20)) &&
       (*len = 1, lVar2 = pos, pos < local_28)) {
      iVar1 = (**pReader->_vptr_IMkvReader)(pReader,pos,1,&local_29);
      if (iVar1 == 0) {
        if (local_29 == 0) {
          lVar2 = -2;
        }
        else {
          if (-1 < (char)local_29) {
            lVar3 = *len;
            uVar4 = 0x80;
            do {
              uVar4 = uVar4 >> 1;
              lVar3 = lVar3 + 1;
            } while ((uVar4 & local_29) == 0);
            *len = lVar3;
          }
          lVar2 = 0;
        }
      }
      else {
        lVar2 = (long)iVar1;
      }
    }
  }
  return lVar2;
}

Assistant:

long long GetUIntLength(IMkvReader* pReader, long long pos, long& len) {
  if (!pReader || pos < 0)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  int status = pReader->Length(&total, &available);
  if (status < 0 || (total >= 0 && available > total))
    return E_FILE_FORMAT_INVALID;

  len = 1;

  if (pos >= available)
    return pos;  // too few bytes available

  unsigned char b;

  status = pReader->Read(pos, 1, &b);

  if (status != 0)
    return status;

  if (b == 0)  // we can't handle u-int values larger than 8 bytes
    return E_FILE_FORMAT_INVALID;

  unsigned char m = 0x80;

  while (!(b & m)) {
    m >>= 1;
    ++len;
  }

  return 0;  // success
}